

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int ParseEXRMultipartHeaderFromFile
              (EXRHeader ***exr_headers,int *num_headers,EXRVersion *exr_version,char *filename,
              char **err)

{
  reference __ptr;
  char *in_RCX;
  long in_RDX;
  allocator_type *in_RSI;
  long in_RDI;
  size_t ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  size_t filesize;
  char **in_stack_00000100;
  size_t in_stack_00000108;
  uchar *in_stack_00000110;
  FILE *fp;
  int *in_stack_00000120;
  EXRHeader ***in_stack_00000128;
  char **in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  char *in_stack_fffffffffffffe88;
  allocator_type *in_stack_fffffffffffffe90;
  size_type in_stack_fffffffffffffe98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffea0;
  allocator local_109;
  string local_108 [32];
  size_t local_e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  size_t local_c0;
  allocator local_b1;
  string local_b0 [32];
  string local_90 [32];
  FILE *local_70;
  allocator local_51;
  string local_50 [40];
  char *local_28;
  allocator_type *local_18;
  int local_4;
  
  if ((((in_RDI == 0) || (in_RSI == (allocator_type *)0x0)) || (in_RDX == 0)) ||
     (in_RCX == (char *)0x0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_50,"Invalid argument for ParseEXRMultipartHeaderFromFile()",&local_51);
    tinyexr::SetErrorMessage
              ((string *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe78);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    local_4 = -3;
  }
  else {
    local_70 = (FILE *)0x0;
    local_28 = in_RCX;
    local_18 = in_RSI;
    local_70 = fopen(in_RCX,"rb");
    if (local_70 == (FILE *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,local_28,&local_b1);
      std::operator+(in_stack_fffffffffffffe88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      tinyexr::SetErrorMessage
                ((string *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 in_stack_fffffffffffffe78);
      std::__cxx11::string::~string(local_90);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      local_4 = -7;
    }
    else {
      fseek(local_70,0,2);
      local_c0 = ftell(local_70);
      fseek(local_70,0,0);
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x450426);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x45044c);
      __ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_d8,0);
      local_e8 = fread(__ptr,1,local_c0,local_70);
      fclose(local_70);
      if (local_e8 == local_c0) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   (size_type)in_stack_fffffffffffffe78);
        local_4 = ParseEXRMultipartHeaderFromMemory
                            (in_stack_00000128,in_stack_00000120,(EXRVersion *)fp,in_stack_00000110,
                             in_stack_00000108,in_stack_00000100);
        in_stack_fffffffffffffe90 = local_18;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_108,"`fread\' error. file may be corrupted.",&local_109);
        tinyexr::SetErrorMessage
                  ((string *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   in_stack_fffffffffffffe78);
        std::__cxx11::string::~string(local_108);
        std::allocator<char>::~allocator((allocator<char> *)&local_109);
        local_4 = -5;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe90)
      ;
    }
  }
  return local_4;
}

Assistant:

int ParseEXRMultipartHeaderFromFile(EXRHeader ***exr_headers, int *num_headers,
                                    const EXRVersion *exr_version,
                                    const char *filename, const char **err) {
  if (exr_headers == NULL || num_headers == NULL || exr_version == NULL ||
      filename == NULL) {
    tinyexr::SetErrorMessage(
        "Invalid argument for ParseEXRMultipartHeaderFromFile()", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  FILE *fp = NULL;
#ifdef _WIN32
#if defined(_MSC_VER) || (defined(MINGW_HAS_SECURE_API) && MINGW_HAS_SECURE_API) // MSVC, MinGW GCC, or Clang.
  errno_t errcode =
      _wfopen_s(&fp, tinyexr::UTF8ToWchar(filename).c_str(), L"rb");
  if (errcode != 0) {
    tinyexr::SetErrorMessage("Cannot read file " + std::string(filename), err);
    return TINYEXR_ERROR_INVALID_FILE;
  }
#else
  // Unknown compiler or MinGW without MINGW_HAS_SECURE_API.
  fp = fopen(filename, "rb");
#endif
#else
  fp = fopen(filename, "rb");
#endif
  if (!fp) {
    tinyexr::SetErrorMessage("Cannot read file " + std::string(filename), err);
    return TINYEXR_ERROR_CANT_OPEN_FILE;
  }

  size_t filesize;
  // Compute size
  fseek(fp, 0, SEEK_END);
  filesize = static_cast<size_t>(ftell(fp));
  fseek(fp, 0, SEEK_SET);

  std::vector<unsigned char> buf(filesize);  // @todo { use mmap }
  {
    size_t ret;
    ret = fread(&buf[0], 1, filesize, fp);
    assert(ret == filesize);
    fclose(fp);

    if (ret != filesize) {
      tinyexr::SetErrorMessage("`fread' error. file may be corrupted.", err);
      return TINYEXR_ERROR_INVALID_FILE;
    }
  }

  return ParseEXRMultipartHeaderFromMemory(
      exr_headers, num_headers, exr_version, &buf.at(0), filesize, err);
}